

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readCustomSection(WasmBinaryReader *this,size_t payloadLen)

{
  size_t sVar1;
  Module *pMVar2;
  pointer pCVar3;
  pointer pcVar4;
  pointer pcVar5;
  char *__s2;
  undefined *puVar6;
  int iVar7;
  size_t __n;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_type __rlen;
  Name NVar11;
  string_view sVar12;
  string local_78;
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  char *local_40;
  allocator_type local_31;
  
  sVar10 = this->pos;
  NVar11 = getInlineString(this,true);
  __s2 = BinaryConsts::CustomSections::Name;
  local_40 = NVar11.super_IString.str._M_str;
  __n = NVar11.super_IString.str._M_len;
  sVar1 = this->pos;
  uVar8 = sVar1 - sVar10;
  sVar10 = payloadLen - uVar8;
  if (payloadLen < uVar8) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bad user section size","");
    throwError(this,&local_78);
  }
  sVar9 = strlen(BinaryConsts::CustomSections::Name);
  if ((__n == sVar9) && ((__n == 0 || (iVar7 = bcmp(local_40,__s2,__n), iVar7 == 0)))) {
    this->pos = sVar10 + sVar1;
    return;
  }
  puVar6 = BinaryConsts::CustomSections::TargetFeatures;
  sVar9 = strlen(BinaryConsts::CustomSections::TargetFeatures);
  if ((__n == sVar9) && ((__n == 0 || (iVar7 = bcmp(local_40,puVar6,__n), iVar7 == 0)))) {
    readFeatures(this,sVar10);
    return;
  }
  puVar6 = BinaryConsts::CustomSections::Dylink;
  sVar9 = strlen(BinaryConsts::CustomSections::Dylink);
  if ((__n == sVar9) && ((__n == 0 || (iVar7 = bcmp(local_40,puVar6,__n), iVar7 == 0)))) {
    readDylink(this,sVar10);
    return;
  }
  puVar6 = BinaryConsts::CustomSections::Dylink0;
  sVar9 = strlen(BinaryConsts::CustomSections::Dylink0);
  if ((__n == sVar9) && ((__n == 0 || (iVar7 = bcmp(local_40,puVar6,__n), iVar7 == 0)))) {
    readDylink0(this,sVar10);
    return;
  }
  puVar6 = BinaryConsts::CustomSections::Linking;
  sVar9 = strlen(BinaryConsts::CustomSections::Linking);
  if ((__n == sVar9) && ((__n == 0 || (iVar7 = bcmp(local_40,puVar6,__n), iVar7 == 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: linking section is present, so this is not a standard wasm file - binaryen cannot handle this properly!\n"
               ,0x71);
  }
  pMVar2 = this->wasm;
  std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::resize
            (&pMVar2->customSections,
             ((long)(pMVar2->customSections).
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMVar2->customSections).
                    super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 + 1);
  pCVar3 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_replace
            ((ulong)(pCVar3 + -1),0,(char *)pCVar3[-1].name._M_string_length,(ulong)local_40);
  sVar12 = getByteView(this,sVar10);
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)&local_58,sVar12._M_str,
             sVar12._M_str + sVar12._M_len,&local_31);
  pcVar4 = pCVar3[-1].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = pCVar3[-1].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pCVar3[-1].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58;
  pCVar3[-1].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcStack_50;
  pCVar3[-1].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_48;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  if ((pcVar4 != (pointer)0x0) &&
     (operator_delete(pcVar4,(long)pcVar5 - (long)pcVar4), local_58 != (pointer)0x0)) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void WasmBinaryReader::readCustomSection(size_t payloadLen) {
  auto oldPos = pos;
  Name sectionName = getInlineString();
  size_t read = pos - oldPos;
  if (read > payloadLen) {
    throwError("bad user section size");
  }
  payloadLen -= read;
  if (sectionName.equals(BinaryConsts::CustomSections::Name)) {
    // We already read the name section before anything else.
    pos += payloadLen;
  } else if (sectionName.equals(BinaryConsts::CustomSections::TargetFeatures)) {
    readFeatures(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink)) {
    readDylink(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink0)) {
    readDylink0(payloadLen);
  } else {
    // an unfamiliar custom section
    if (sectionName.equals(BinaryConsts::CustomSections::Linking)) {
      std::cerr
        << "warning: linking section is present, so this is not a standard "
           "wasm file - binaryen cannot handle this properly!\n";
    }
    wasm.customSections.resize(wasm.customSections.size() + 1);
    auto& section = wasm.customSections.back();
    section.name = sectionName.str;
    auto data = getByteView(payloadLen);
    section.data = {data.begin(), data.end()};
  }
}